

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fusion.c
# Opt level: O0

int non_temporal_setup(ptls_aead_context_t *_ctx,int is_enc,void *key,void *iv,size_t key_size)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  uint aesni256_00;
  int iVar3;
  ptls_fusion_aesgcm_context_t *ppVar4;
  code *pcVar5;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr *in_XMM0_Qa;
  _func_void_st_ptls_aead_context_t_ptr_void_ptr *in_XMM0_Qb;
  bool local_65;
  int aesni256;
  aesgcm_context *ctx;
  size_t key_size_local;
  void *iv_local;
  void *key_local;
  int is_enc_local;
  ptls_aead_context_t *_ctx_local;
  
  local_65 = is_enc != 0 && ptls_fusion_can_aesni256 != 0;
  aesni256_00 = (uint)local_65;
  loadn128(iv,0xc);
  _ctx[1].do_get_iv = in_XMM0_Qa;
  _ctx[1].do_set_iv = in_XMM0_Qb;
  auVar2._0_8_ = _ctx[1].do_get_iv;
  auVar2._8_8_ = _ctx[1].do_set_iv;
  auVar1[8] = '\a';
  auVar1[9] = '\x06';
  auVar1[10] = '\x05';
  auVar1[0xb] = '\x04';
  auVar1[0xc] = '\x03';
  auVar1[0xd] = '\x02';
  auVar1[0xe] = '\x01';
  auVar1[0xf] = '\0';
  auVar1[0] = '\x0f';
  auVar1[1] = '\x0e';
  auVar1[2] = '\r';
  auVar1[3] = '\f';
  auVar1[4] = '\v';
  auVar1[5] = '\n';
  auVar1[6] = '\t';
  auVar1[7] = '\b';
  auVar1 = vpshufb_avx(auVar2,auVar1);
  _ctx[1].do_get_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)auVar1._0_8_;
  _ctx[1].do_set_iv = (_func_void_st_ptls_aead_context_t_ptr_void_ptr *)auVar1._8_8_;
  if (key != (void *)0x0) {
    _ctx->dispose_crypto = aesgcm_dispose_crypto;
    _ctx->do_get_iv = aesgcm_get_iv;
    _ctx->do_set_iv = aesgcm_set_iv;
    _ctx->do_encrypt_init = (_func_void_st_ptls_aead_context_t_ptr_uint64_t_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_update =
         (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t *)0x0;
    _ctx->do_encrypt_final = (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr *)0x0;
    if (is_enc == 0) {
      if (aesni256_00 != 0) {
        __assert_fail("!aesni256",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/t/../lib/fusion.c"
                      ,0x852,
                      "int non_temporal_setup(ptls_aead_context_t *, int, const void *, const void *, size_t)"
                     );
      }
      _ctx->do_encrypt =
           (_func_void_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t_ptls_aead_supplementary_encryption_t_ptr
            *)0x0;
      _ctx->do_encrypt_v =
           (_func_void_st_ptls_aead_context_t_ptr_void_ptr_ptls_iovec_t_ptr_size_t_uint64_t_void_ptr_size_t
            *)0x0;
      _ctx->do_decrypt = non_temporal_decrypt128;
    }
    else {
      _ctx->do_encrypt = ptls_aead__do_encrypt;
      pcVar5 = non_temporal_encrypt_v128;
      if (aesni256_00 != 0) {
        pcVar5 = non_temporal_encrypt_v256;
      }
      _ctx->do_encrypt_v = pcVar5;
      _ctx->do_decrypt =
           (_func_size_t_st_ptls_aead_context_t_ptr_void_ptr_void_ptr_size_t_uint64_t_void_ptr_size_t
            *)0x0;
    }
    iVar3 = 0x10;
    if (ptls_fusion_can_aesni256 != 0) {
      iVar3 = 0x20;
    }
    ppVar4 = new_aesgcm(key,key_size,(long)(iVar3 * 7),aesni256_00);
    _ctx[1].algo = (st_ptls_aead_algorithm_t *)ppVar4;
  }
  return 0;
}

Assistant:

static int non_temporal_setup(ptls_aead_context_t *_ctx, int is_enc, const void *key, const void *iv, size_t key_size)
{
    struct aesgcm_context *ctx = (struct aesgcm_context *)_ctx;
    int aesni256 = is_enc && ptls_fusion_can_aesni256;

    ctx->static_iv = loadn128(iv, PTLS_AESGCM_IV_SIZE);
    ctx->static_iv = _mm_shuffle_epi8(ctx->static_iv, byteswap128);
    if (key == NULL)
        return 0;

    ctx->super.dispose_crypto = aesgcm_dispose_crypto;
    ctx->super.do_get_iv = aesgcm_get_iv;
    ctx->super.do_set_iv = aesgcm_set_iv;
    ctx->super.do_encrypt_init = NULL;
    ctx->super.do_encrypt_update = NULL;
    ctx->super.do_encrypt_final = NULL;
    if (is_enc) {
        ctx->super.do_encrypt = ptls_aead__do_encrypt;
        ctx->super.do_encrypt_v = aesni256 ? non_temporal_encrypt_v256 : non_temporal_encrypt_v128;
        ctx->super.do_decrypt = NULL;
    } else {
        assert(!aesni256);
        ctx->super.do_encrypt = NULL;
        ctx->super.do_encrypt_v = NULL;
        ctx->super.do_decrypt = non_temporal_decrypt128;
    }

    ctx->aesgcm =
        new_aesgcm(key, key_size,
                   7 * (ptls_fusion_can_aesni256 ? 32 : 16), // 6 blocks at once, plus len(A) | len(C) that we might append
                   aesni256);

    return 0;
}